

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
::
copyAndNormalizeCosts<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
          (HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
           *this,matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 *cost_function)

{
  long lVar1;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  size_type i;
  const_reference pdVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_type sVar18;
  long lVar19;
  size_type sVar20;
  size_type sVar21;
  long lVar22;
  
  if (*(ulong *)(this + 8) < *(ulong *)this) {
    if (*(long *)(this + 8) != 0) {
      sVar21 = 0;
      do {
        lVar12 = *(long *)(this + 0xe0);
        if (*(long *)this != 0) {
          sVar20 = 0;
          sVar18 = sVar21;
          do {
            i = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                          (sVar20,cost_function->size1_,sVar21,cost_function->size2_);
            pdVar5 = boost::numeric::ublas::
                     unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                     ::operator[](&cost_function->data_,i);
            lVar22 = pdVar5->rep_;
            *(long *)(*(long *)(this + 0xe8) + sVar18 * 8) = lVar22;
            if (lVar22 < lVar12) {
              lVar12 = lVar22;
            }
            if (sVar20 == 0) {
              lVar12 = lVar22;
            }
            sVar20 = sVar20 + 1;
            sVar18 = sVar18 + *(long *)(this + 8);
          } while (sVar20 < *(ulong *)this);
        }
        if (*(long *)this != 0) {
          lVar22 = *(long *)(this + 0xe8);
          lVar9 = *(long *)(this + 0x10);
          sVar18 = sVar21 + 0x3f;
          if (-1 < (long)sVar21) {
            sVar18 = sVar21;
          }
          lVar6 = ((long)sVar18 >> 6) * 8 + *(long *)(this + 0x38);
          lVar3 = *(long *)(this + 0x60);
          uVar7 = 1L << ((byte)sVar21 & 0x3f);
          lVar1 = (ulong)((sVar21 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
          lVar4 = *(long *)(this + 0x88);
          uVar11 = 0;
          sVar18 = sVar21;
          do {
            lVar8 = *(long *)(lVar22 + sVar18 * 8) - lVar12;
            lVar19 = -lVar8;
            if (0 < lVar8) {
              lVar19 = lVar8;
            }
            *(long *)(lVar22 + sVar18 * 8) = lVar19;
            if (lVar19 == *(long *)(this + 0xe0)) {
              uVar13 = sVar18 + 0x3f;
              if (-1 < (long)sVar18) {
                uVar13 = sVar18;
              }
              uVar16 = (ulong)((sVar18 & 0x800000000000003f) < 0x8000000000000001);
              uVar17 = 1L << ((byte)sVar18 & 0x3f);
              puVar2 = (ulong *)(((long)uVar13 >> 6) * 8 + lVar3 + -8 + uVar16 * 8);
              *puVar2 = *puVar2 | uVar17;
              uVar14 = uVar11 + 0x3f;
              if (-1 < (long)uVar11) {
                uVar14 = uVar11;
              }
              uVar15 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
              lVar19 = lVar9 + ((long)uVar14 >> 6) * 8;
              if (((*(ulong *)(lVar19 + -8 + uVar15 * 8) >> (uVar11 & 0x3f) & 1) == 0) &&
                 ((*(ulong *)(lVar6 + lVar1) & uVar7) == 0)) {
                puVar2 = (ulong *)(uVar16 * 8 + -8 + lVar4 + ((long)uVar13 >> 6) * 8);
                *puVar2 = *puVar2 | uVar17;
                puVar2 = (ulong *)(lVar19 + uVar15 * 8 + -8);
                *puVar2 = *puVar2 | 1L << ((byte)uVar11 & 0x3f);
                puVar2 = (ulong *)(lVar6 + lVar1);
                *puVar2 = *puVar2 | uVar7;
              }
            }
            uVar11 = uVar11 + 1;
            sVar18 = sVar18 + *(long *)(this + 8);
          } while (uVar11 < *(ulong *)this);
        }
        sVar21 = sVar21 + 1;
      } while (sVar21 < *(ulong *)(this + 8));
    }
  }
  else if (*(long *)this != 0) {
    sVar21 = 0;
    lVar12 = 0;
    do {
      uVar7 = *(ulong *)(this + 8);
      lVar22 = *(long *)(this + 0xe0);
      if (uVar7 != 0) {
        sVar18 = 0;
        do {
          sVar20 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                             (sVar21,cost_function->size1_,sVar18,cost_function->size2_);
          pdVar5 = boost::numeric::ublas::
                   unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                   ::operator[](&cost_function->data_,sVar20);
          lVar9 = pdVar5->rep_;
          if (lVar9 < lVar22) {
            lVar22 = lVar9;
          }
          *(long *)(*(long *)(this + 0xe8) + lVar12 * 8) = lVar9;
          if (sVar18 == 0) {
            lVar22 = lVar9;
          }
          sVar18 = sVar18 + 1;
          lVar12 = lVar12 + 1;
          uVar7 = *(ulong *)(this + 8);
        } while (sVar18 < uVar7);
      }
      lVar9 = lVar12 - uVar7;
      if (*(long *)(this + 8) != 0) {
        lVar1 = *(long *)(this + 0x38);
        sVar18 = sVar21 + 0x3f;
        if (-1 < (long)sVar21) {
          sVar18 = sVar21;
        }
        lVar19 = ((long)sVar18 >> 6) * 8 + *(long *)(this + 0x10);
        lVar4 = *(long *)(this + 0x60);
        uVar11 = 1L << ((byte)sVar21 & 0x3f);
        lVar3 = (ulong)((sVar21 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
        lVar6 = *(long *)(this + 0x88);
        lVar12 = lVar12 * 8 + uVar7 * -8 + *(long *)(this + 0xe8);
        uVar7 = 0;
        do {
          lVar10 = *(long *)(lVar12 + uVar7 * 8) - lVar22;
          lVar8 = -lVar10;
          if (0 < lVar10) {
            lVar8 = lVar10;
          }
          *(long *)(lVar12 + uVar7 * 8) = lVar8;
          if (lVar8 == *(long *)(this + 0xe0)) {
            uVar13 = lVar9 + uVar7;
            uVar14 = uVar13 + 0x3f;
            if (-1 < (long)uVar13) {
              uVar14 = uVar13;
            }
            uVar17 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
            uVar13 = 1L << ((byte)uVar13 & 0x3f);
            puVar2 = (ulong *)(lVar4 + ((long)uVar14 >> 6) * 8 + -8 + uVar17 * 8);
            *puVar2 = *puVar2 | uVar13;
            if ((*(ulong *)(lVar19 + lVar3) & uVar11) == 0) {
              uVar16 = uVar7 + 0x3f;
              if (-1 < (long)uVar7) {
                uVar16 = uVar7;
              }
              uVar15 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
              lVar8 = lVar1 + ((long)uVar16 >> 6) * 8;
              if ((*(ulong *)(lVar8 + -8 + uVar15 * 8) >> (uVar7 & 0x3f) & 1) == 0) {
                puVar2 = (ulong *)(uVar17 * 8 + -8 + lVar6 + ((long)uVar14 >> 6) * 8);
                *puVar2 = *puVar2 | uVar13;
                puVar2 = (ulong *)(lVar19 + lVar3);
                *puVar2 = *puVar2 | uVar11;
                puVar2 = (ulong *)(lVar8 + uVar15 * 8 + -8);
                *puVar2 = *puVar2 | 1L << ((byte)uVar7 & 0x3f);
              }
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < *(ulong *)(this + 8));
        lVar9 = lVar9 + uVar7;
      }
      sVar21 = sVar21 + 1;
      lVar12 = lVar9;
    } while (sVar21 < *(ulong *)this);
  }
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)(this + 0x10),*(size_t *)this,false);
  return;
}

Assistant:

void copyAndNormalizeCosts(const CostFunction& cost_function)
  {
    if (num_rows_ <= num_cols_)
    {
      // Copy costs from cost function and find best cost per row:
      std::size_t i = 0;
      for (std::size_t row = 0; row < num_rows_; ++row)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (col == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        i -= num_cols_; // Reset index to beginning of row

        // Subtract best cost in row from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in row if column is not already covered:
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    else
    {
      // Copy costs from cost function and find best cost per column:
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (row == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        // Subtract best cost in column from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in column if column is not already covered:
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    covered_rows_.assign(num_rows_, false);
  }